

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O1

char * Rml::LegalVariableName(String *name)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  const_iterator cVar4;
  size_type sVar5;
  char *pcVar6;
  long lVar7;
  long *plVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  String name_lower;
  allocator_type local_122;
  key_compare local_121;
  String local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40 [2];
  long local_30 [2];
  
  if ((LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&LegalVariableName(std::__cxx11::string_const&)::
                                   reserved_names_abi_cxx11_), iVar3 != 0)) {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"it","");
    local_e0[0] = local_d0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"it_index","");
    local_c0[0] = local_b0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"ev","");
    local_a0[0] = local_90;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"true","");
    local_80[0] = local_70;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"false","");
    local_60[0] = local_50;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"size","");
    plVar8 = local_30;
    local_40[0] = plVar8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"literal","");
    init._M_len = 7;
    init._M_array = &local_100;
    itlib::
    flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::flat_set(&LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_,init,
               &local_121,&local_122);
    lVar7 = -0xe0;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    __cxa_atexit(itlib::
                 flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~flat_set,
                 &LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_);
  }
  if (name->_M_string_length == 0) {
    pcVar6 = "Name cannot be empty.";
  }
  else {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + name->_M_string_length);
    StringUtilities::ToLower(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((byte)(*local_100._M_dataplus._M_p + 0x9fU) < 0x1a) {
      if (local_100._M_string_length != 0) {
        sVar5 = 0;
        pcVar6 = "Name must strictly contain characters a-z, A-Z, 0-9 and under_score.";
        do {
          cVar1 = local_100._M_dataplus._M_p[sVar5];
          if (((9 < (byte)(cVar1 - 0x30U)) && (cVar1 != '_')) && (0x19 < (byte)(cVar1 + 0x9fU)))
          goto LAB_001f8c3a;
          sVar5 = sVar5 + 1;
        } while (local_100._M_string_length != sVar5);
      }
      cVar4 = itlib::
              flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::find<std::__cxx11::string>
                        ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&LegalVariableName(std::__cxx11::string_const&)::
                             reserved_names_abi_cxx11_,&local_100);
      pcVar6 = (char *)0x0;
      if (cVar4._M_current !=
          LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_.m_container.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar6 = "Name is reserved.";
      }
    }
    else {
      pcVar6 = "First character must be \'a-z\' or \'A-Z\'.";
    }
LAB_001f8c3a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar6;
}

Assistant:

static const char* LegalVariableName(const String& name)
{
	static SmallUnorderedSet<String> reserved_names{"it", "it_index", "ev", "true", "false", "size", "literal"};

	if (name.empty())
		return "Name cannot be empty.";

	const String name_lower = StringUtilities::ToLower(name);

	const char first = name_lower.front();
	if (!(first >= 'a' && first <= 'z'))
		return "First character must be 'a-z' or 'A-Z'.";

	for (const char c : name_lower)
	{
		if (!(c == '_' || (c >= 'a' && c <= 'z') || (c >= '0' && c <= '9')))
			return "Name must strictly contain characters a-z, A-Z, 0-9 and under_score.";
	}

	if (reserved_names.count(name_lower) == 1)
		return "Name is reserved.";

	return nullptr;
}